

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O2

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionD
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  undefined1 auVar1 [16];
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  complex<double> cVar8;
  complex<double> g;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  complex<double> local_78;
  complex<double> local_60;
  double local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  complex<double> local_30;
  undefined1 local_20 [16];
  
  dVar3 = omega;
  dVar2 = HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  dVar4 = dVar3;
  bTerm(this,omega);
  dVar5 = dVar4;
  gTerm(this,omega);
  auVar7._0_8_ = extraout_XMM0_Qa - extraout_XMM0_Qa_00;
  auVar7._8_8_ = dVar3 - dVar4;
  auVar1._8_8_ = dVar2 * dVar2;
  auVar1._0_8_ = dVar2 * dVar2;
  local_78._M_value = (_ComplexT)divpd(auVar7,auVar1);
  uVar6 = local_78._M_value._0_8_;
  local_88 = tau * -extraout_XMM0_Qa_00;
  dStack_80 = tau * -dVar4;
  local_20._8_8_ = dVar5;
  std::exp<double>((complex<double> *)&local_88);
  uVar6 = uVar6 ^ 0x8000000000000000;
  local_40 = 1.0 - extraout_XMM0_Qa_01;
  local_38 = uVar6;
  std::operator*(&local_78,(complex<double> *)&local_40);
  local_98 = tau * -extraout_XMM0_Qa_00;
  dStack_90 = tau * -dVar4;
  local_30._M_value._8_8_ = uVar6;
  std::exp<double>((complex<double> *)&local_98);
  local_60._M_value._8_8_ = uVar6;
  std::operator*((complex<double> *)local_20,&local_60);
  local_48 = uVar6 ^ 0x8000000000000000;
  local_50 = 1.0 - extraout_XMM0_Qa_02;
  cVar8 = std::operator/(&local_30,(complex<double> *)&local_50);
  return (complex<double>)cVar8._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionD(double tau, double omega) const {
    double sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega), 
                         b = bTerm(omega),
                         g = gTerm(omega);
    std::complex<double> D_init = (a-b)/(sigma*sigma); //definition during class
    return D_init*(1.-std::exp(-b*tau))/(1.-g*std::exp(-b*tau)); // in class
    // return D_init*(1.-std::exp(b*tau))/(1.-g*std::exp(b*tau)); // in PDF
}